

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompleter.cpp
# Opt level: O3

void __thiscall QCompleter::setPopup(QCompleter *this,QAbstractItemView *popup)

{
  long lVar1;
  FocusPolicy policy;
  QItemSelectionModel *pQVar2;
  QAbstractItemModel *pQVar3;
  long lVar4;
  QStyledItemDelegate *this_00;
  QListView *this_01;
  QWidget *w;
  QAbstractItemView *pQVar5;
  QWidget *this_02;
  long in_FS_OFFSET;
  Connection CStack_48;
  QObject local_40 [8];
  QObject local_38 [8];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&this->field_0x8;
  pQVar5 = *(QAbstractItemView **)(lVar1 + 0x90);
  if (pQVar5 == (QAbstractItemView *)popup) goto LAB_0064c0c9;
  policy = NoFocus;
  if (((*(long *)(lVar1 + 0x78) != 0) &&
      (policy = NoFocus, *(int *)(*(long *)(lVar1 + 0x78) + 4) != 0)) &&
     (*(QWidget **)(lVar1 + 0x80) != (QWidget *)0x0)) {
    policy = QWidget::focusPolicy(*(QWidget **)(lVar1 + 0x80));
    pQVar5 = *(QAbstractItemView **)(lVar1 + 0x90);
  }
  if (pQVar5 != (QAbstractItemView *)0x0) {
    pQVar2 = QAbstractItemView::selectionModel(pQVar5);
    QObject::disconnect((QObject *)pQVar2,(char *)0x0,&this->super_QObject,(char *)0x0);
    QObject::disconnect(*(QObject **)(lVar1 + 0x90),(char *)0x0,&this->super_QObject,(char *)0x0);
    if (*(long **)(lVar1 + 0x90) != (long *)0x0) {
      (**(code **)(**(long **)(lVar1 + 0x90) + 0x20))();
    }
  }
  *(QAbstractItemView **)(lVar1 + 0x90) = popup;
  pQVar3 = QAbstractItemView::model((QAbstractItemView *)popup);
  if (pQVar3 != *(QAbstractItemModel **)(lVar1 + 0x88)) {
    (**(code **)(**(long **)(lVar1 + 0x90) + 0x1c8))();
  }
  QWidget::hide(*(QWidget **)(lVar1 + 0x90));
  QWidget::setParent(*(QWidget **)(lVar1 + 0x90),(QWidget *)0x0);
  QWidget::setWindowFlag(*(QWidget **)(lVar1 + 0x90),Popup,true);
  QWidget::setFocusPolicy(*(QWidget **)(lVar1 + 0x90),NoFocus);
  lVar4 = *(long *)(lVar1 + 0x78);
  if (lVar4 == 0) {
    this_02 = *(QWidget **)(lVar1 + 0x90);
LAB_0064bfb7:
    w = (QWidget *)0x0;
  }
  else {
    if ((*(int *)(lVar4 + 4) == 0) || (*(QWidget **)(lVar1 + 0x80) == (QWidget *)0x0)) {
      this_02 = *(QWidget **)(lVar1 + 0x90);
    }
    else {
      QWidget::setFocusPolicy(*(QWidget **)(lVar1 + 0x80),policy);
      lVar4 = *(long *)(lVar1 + 0x78);
      this_02 = *(QWidget **)(lVar1 + 0x90);
      if (lVar4 == 0) goto LAB_0064bfb7;
    }
    if (*(int *)(lVar4 + 4) == 0) goto LAB_0064bfb7;
    w = *(QWidget **)(lVar1 + 0x80);
  }
  QWidget::setFocusProxy(this_02,w);
  QObject::installEventFilter(*(QObject **)(lVar1 + 0x90));
  pQVar5 = *(QAbstractItemView **)(lVar1 + 0x90);
  this_00 = (QStyledItemDelegate *)operator_new(0x18);
  QStyledItemDelegate::QStyledItemDelegate(this_00,(QObject *)pQVar5);
  *(undefined ***)this_00 = &PTR_metaObject_00815738;
  *(QAbstractItemView **)(this_00 + 0x10) = pQVar5;
  QAbstractItemView::setItemDelegate(pQVar5,(QAbstractItemDelegate *)this_00);
  this_01 = (QListView *)QMetaObject::cast((QObject *)&QListView::staticMetaObject);
  if (this_01 != (QListView *)0x0) {
    QListView::setModelColumn(this_01,*(int *)(lVar1 + 0xc0));
  }
  QObject::connect(local_38,*(char **)(lVar1 + 0x90),(QObject *)"2clicked(QModelIndex)",(char *)this
                   ,0x6f741f);
  QMetaObject::Connection::~Connection((Connection *)local_38);
  QObject::connect(local_40,(char *)this,(QObject *)"2activated(QModelIndex)",
                   *(char **)(lVar1 + 0x90),0x6f7451);
  QMetaObject::Connection::~Connection((Connection *)local_40);
  pQVar2 = QAbstractItemView::selectionModel(*(QAbstractItemView **)(lVar1 + 0x90));
  QObject::connect((QObject *)&CStack_48,(char *)pQVar2,
                   (QObject *)"2selectionChanged(QItemSelection,QItemSelection)",(char *)this,
                   0x6f748a);
  QMetaObject::Connection::~Connection(&CStack_48);
LAB_0064c0c9:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QCompleter::setPopup(QAbstractItemView *popup)
{
    Q_ASSERT(popup);
    Q_D(QCompleter);
    if (popup == d->popup)
        return;

    // Remember existing widget's focus policy, default to NoFocus
    const Qt::FocusPolicy origPolicy = d->widget ? d->widget->focusPolicy()
                                                 : Qt::NoFocus;

    // If popup existed already, disconnect signals and delete object
    if (d->popup) {
        QObject::disconnect(d->popup->selectionModel(), nullptr, this, nullptr);
        QObject::disconnect(d->popup, nullptr, this, nullptr);
        delete d->popup;
    }

    // Assign new object, set model and hide
    d->popup = popup;
    if (d->popup->model() != d->proxy)
        d->popup->setModel(d->proxy);
    d->popup->hide();

    // Mark the widget window as a popup, so that if the last non-popup window is closed by the
    // user, the application should not be prevented from exiting. It needs to be set explicitly via
    // setWindowFlag(), because passing the flag via setParent(parent, windowFlags) does not call
    // QWidgetPrivate::adjustQuitOnCloseAttribute(), and causes an application not to exit if the
    // popup ends up being the last window.
    d->popup->setParent(nullptr);
    d->popup->setWindowFlag(Qt::Popup);
    d->popup->setFocusPolicy(Qt::NoFocus);
    if (d->widget)
        d->widget->setFocusPolicy(origPolicy);

    d->popup->setFocusProxy(d->widget);
    d->popup->installEventFilter(this);
    d->popup->setItemDelegate(new QCompleterItemDelegate(d->popup));
#if QT_CONFIG(listview)
    if (QListView *listView = qobject_cast<QListView *>(d->popup)) {
        listView->setModelColumn(d->column);
    }
#endif

    QObject::connect(d->popup, SIGNAL(clicked(QModelIndex)),
                     this, SLOT(_q_complete(QModelIndex)));
    QObject::connect(this, SIGNAL(activated(QModelIndex)),
                     d->popup, SLOT(hide()));

    QObject::connect(d->popup->selectionModel(), SIGNAL(selectionChanged(QItemSelection,QItemSelection)),
                     this, SLOT(_q_completionSelected(QItemSelection)));
}